

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_order.cpp
# Opt level: O2

void __thiscall duckdb::LogicalOrder::ResolveTypes(LogicalOrder *this)

{
  int iVar1;
  reference this_00;
  pointer pLVar2;
  vector<duckdb::LogicalType,_true> child_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_28;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(this->super_LogicalOperator).children,0);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,
             &(pLVar2->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  iVar1 = (*(this->super_LogicalOperator)._vptr_LogicalOperator[0xc])(this);
  if ((char)iVar1 == '\0') {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(this->super_LogicalOperator).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_40);
  }
  else {
    LogicalOperator::MapTypes
              ((vector<duckdb::LogicalType,_true> *)&local_28,
               (vector<duckdb::LogicalType,_true> *)&local_40,&this->projection_map);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(this->super_LogicalOperator).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_28);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_28);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  return;
}

Assistant:

void LogicalOrder::ResolveTypes() {
	const auto child_types = children[0]->types;
	if (!HasProjectionMap()) {
		types = child_types;
	} else {
		types = MapTypes(child_types, projection_map);
	}
}